

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworksInDomain
          (Registry *this,string *aDomainName,NetworkArray *aRet)

{
  size_t __n;
  bool bVar1;
  char cVar2;
  Status SVar3;
  int iVar4;
  uint uVar5;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  Domain curDom;
  Domain dom;
  Network nwk;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  local_128;
  Domain local_108;
  Network local_e0;
  Network local_80;
  
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Network::Network(&local_80);
  __n = aDomainName->_M_string_length;
  if ((__n == DAT_0028ed38) &&
     ((__n == 0 ||
      (iVar4 = bcmp((aDomainName->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_THIS_abi_cxx11_,__n
                   ), iVar4 == 0)))) {
    Domain::Domain(&local_108);
    Network::Network(&local_e0);
    SVar3 = GetCurrentNetwork(this,&local_e0);
    if (SVar3 == kSuccess) {
      uVar5 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                        (this->mStorage,&local_e0.mDomainId,&local_108);
      SVar3 = (Status)uVar5;
      if (SVar3 != kSuccess) {
        if ((uVar5 & 0xff) != 1) {
          SVar3 = kError;
        }
        goto LAB_0017d5b1;
      }
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::push_back(&local_128,&local_108);
      bVar1 = true;
      SVar3 = kSuccess;
    }
    else {
LAB_0017d5b1:
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.mMlp._M_dataplus._M_p != &local_e0.mMlp.field_2) {
      operator_delete(local_e0.mMlp._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.mName._M_dataplus._M_p != &local_e0.mName.field_2) {
      operator_delete(local_e0.mName._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.mName._M_dataplus._M_p != &local_108.mName.field_2) {
      operator_delete(local_108.mName._M_dataplus._M_p);
    }
    if (!bVar1) goto LAB_0017d64e;
  }
  else {
    DomainId::DomainId(&local_108.mId,0xffffffff);
    Domain::Domain((Domain *)&local_e0,&local_108.mId,aDomainName);
    iVar4 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,&local_e0,&local_128);
    cVar2 = (char)iVar4;
    SVar3 = kNotFound;
    if (cVar2 != '\x01') {
      SVar3 = (cVar2 != '\0') << 2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.mName._M_dataplus._M_p != &local_e0.mName.field_2) {
      operator_delete(local_e0.mName._M_dataplus._M_p);
    }
    if (cVar2 != '\0') goto LAB_0017d64e;
  }
  SVar3 = kAmbiguity;
  if ((ulong)(((long)local_128.
                     super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_128.
                     super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2) {
    local_80.mDomainId.mId =
         ((local_128.
           super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
           ._M_impl.super__Vector_impl_data._M_start)->mId).mId;
    iVar4 = (*this->mStorage->_vptr_PersistentStorage[0x16])(this->mStorage,&local_80,aRet);
    SVar3 = kNotFound;
    if ((char)iVar4 != '\x01') {
      SVar3 = ((char)iVar4 != '\0') << 2;
    }
  }
LAB_0017d64e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mMlp._M_dataplus._M_p != &local_80.mMlp.field_2) {
    operator_delete(local_80.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mName._M_dataplus._M_p != &local_80.mName.field_2) {
    operator_delete(local_80.mName._M_dataplus._M_p);
  }
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&local_128);
  return SVar3;
}

Assistant:

Registry::Status Registry::GetNetworksInDomain(const std::string &aDomainName, NetworkArray &aRet)
{
    Registry::Status    status;
    std::vector<Domain> domains;
    Network             nwk{};

    if (aDomainName == ALIAS_THIS)
    {
        Domain  curDom;
        Network curNwk;
        status = GetCurrentNetwork(curNwk);
        if (status == Registry::Status::kSuccess)
        {
            status = MapStatus(mStorage->Get(curNwk.mDomainId, curDom));
        }
        VerifyOrExit(status == Registry::Status::kSuccess);
        domains.push_back(curDom);
    }
    else
    {
        Domain dom{DomainId{EMPTY_ID}, aDomainName};
        VerifyOrExit((status = MapStatus(mStorage->Lookup(dom, domains))) == Registry::Status::kSuccess);
    }
    VerifyOrExit(domains.size() < 2, status = Registry::Status::kAmbiguity);
    nwk.mDomainId = domains[0].mId;
    status        = MapStatus(mStorage->Lookup(nwk, aRet));
exit:
    return status;
}